

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pscp.c
# Opt level: O3

_Bool pscp_eof(Seat *seat)

{
  if (((using_sftp) || (uploading == '\x01')) && (sent_eof == '\0')) {
    seat_connection_fatal(pscp_seat,"Received unexpected end-of-file from server");
  }
  return false;
}

Assistant:

static bool pscp_eof(Seat *seat)
{
    /*
     * We usually expect to be the party deciding when to close the
     * connection, so if we see EOF before we sent it ourselves, we
     * should panic. The exception is if we're using old-style scp and
     * downloading rather than uploading.
     */
    if ((using_sftp || uploading) && !sent_eof) {
        seat_connection_fatal(
            pscp_seat, "Received unexpected end-of-file from server");
    }
    return false;
}